

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O2

TracedFunctions * __thiscall
wasm::TraceCalls::parseArgument
          (TracedFunctions *__return_storage_ptr__,TraceCalls *this,string *arg)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  pointer str;
  IString local_c0;
  IString local_b0;
  Split local_a0;
  undefined1 local_80 [8];
  string traceName;
  undefined1 local_58 [8];
  string originName;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  traceName.field_2._8_8_ = this;
  originName.field_2._8_8_ = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,",",(allocator<char> *)local_80);
  String::Split::Split(&local_a0,arg,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  for (str = local_a0.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      str != local_a0.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; str = str + 1) {
    if (str->_M_string_length != 0) {
      local_58 = (undefined1  [8])&originName._M_string_length;
      originName._M_dataplus._M_p = (pointer)0x0;
      originName._M_string_length._0_1_ = 0;
      local_80 = (undefined1  [8])&traceName._M_string_length;
      traceName._M_dataplus._M_p = (pointer)0x0;
      traceName._M_string_length._0_1_ = 0;
      parseFunctionName((TraceCalls *)traceName.field_2._8_8_,str,(string *)local_58,
                        (string *)local_80);
      IString::IString(&local_b0,(string *)local_80);
      IString::IString(&local_c0,(string *)local_58);
      pmVar2 = std::
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                             *)originName.field_2._8_8_,(key_type *)&local_c0);
      (pmVar2->super_IString).str._M_len = local_b0.str._M_len;
      (pmVar2->super_IString).str._M_str = local_b0.str._M_str;
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return (TracedFunctions *)originName.field_2._8_8_;
}

Assistant:

TracedFunctions parseArgument(const std::string& arg) {
    TracedFunctions tracedFunctions;

    for (const auto& definition : String::Split(arg, ",")) {
      if (definition.empty()) {
        // Empty definition, ignore.
        continue;
      }

      std::string originName, traceName;
      parseFunctionName(definition, originName, traceName);

      tracedFunctions[Name(originName)] = Name(traceName);
    }

    return tracedFunctions;
  }